

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void keyboardHandleKeymap(void *userData,wl_keyboard *keyboard,uint32_t format,int fd,uint32_t size)

{
  char *__addr;
  xkb_keymap *pxVar1;
  xkb_state *pxVar2;
  xkb_compose_table *pxVar3;
  xkb_compose_state *pxVar4;
  int in_ECX;
  int in_EDX;
  uint in_R8D;
  char *locale;
  char *mapStr;
  xkb_compose_state *composeState;
  xkb_compose_table *composeTable;
  xkb_state *state;
  xkb_keymap *keymap;
  char *local_50;
  
  if (in_EDX == 1) {
    __addr = (char *)mmap((void *)0x0,(ulong)in_R8D,1,1,in_ECX,0);
    if (__addr == (char *)0xffffffffffffffff) {
      close(in_ECX);
    }
    else {
      pxVar1 = (*_glfw.wl.xkb.keymap_new_from_string)
                         (_glfw.wl.xkb.context,__addr,XKB_KEYMAP_FORMAT_TEXT_V1,
                          XKB_KEYMAP_COMPILE_NO_FLAGS);
      munmap(__addr,(ulong)in_R8D);
      close(in_ECX);
      if (pxVar1 == (xkb_keymap *)0x0) {
        _glfwInputError(0x10008,"Wayland: Failed to compile keymap");
      }
      else {
        pxVar2 = (*_glfw.wl.xkb.state_new)(pxVar1);
        if (pxVar2 == (xkb_state *)0x0) {
          _glfwInputError(0x10008,"Wayland: Failed to create XKB state");
          (*_glfw.wl.xkb.keymap_unref)(pxVar1);
        }
        else {
          local_50 = getenv("LC_ALL");
          if (local_50 == (char *)0x0) {
            local_50 = getenv("LC_CTYPE");
          }
          if (local_50 == (char *)0x0) {
            local_50 = getenv("LANG");
          }
          if (local_50 == (char *)0x0) {
            local_50 = "C";
          }
          pxVar3 = (*_glfw.wl.xkb.compose_table_new_from_locale)
                             (_glfw.wl.xkb.context,local_50,XKB_COMPOSE_COMPILE_NO_FLAGS);
          if (pxVar3 == (xkb_compose_table *)0x0) {
            _glfwInputError(0x10008,"Wayland: Failed to create XKB compose table");
            pxVar4 = _glfw.wl.xkb.composeState;
          }
          else {
            pxVar4 = (*_glfw.wl.xkb.compose_state_new)(pxVar3,XKB_COMPOSE_STATE_NO_FLAGS);
            (*_glfw.wl.xkb.compose_table_unref)(pxVar3);
            if (pxVar4 == (xkb_compose_state *)0x0) {
              _glfwInputError(0x10008,"Wayland: Failed to create XKB compose state");
              pxVar4 = _glfw.wl.xkb.composeState;
            }
          }
          _glfw.wl.xkb.composeState = pxVar4;
          (*_glfw.wl.xkb.keymap_unref)(_glfw.wl.xkb.keymap);
          (*_glfw.wl.xkb.state_unref)(_glfw.wl.xkb.state);
          _glfw.wl.xkb.keymap = pxVar1;
          _glfw.wl.xkb.state = pxVar2;
          _glfw.wl.xkb.controlIndex = (*_glfw.wl.xkb.keymap_mod_get_index)(pxVar1,"Control");
          _glfw.wl.xkb.altIndex = (*_glfw.wl.xkb.keymap_mod_get_index)(_glfw.wl.xkb.keymap,"Mod1");
          _glfw.wl.xkb.shiftIndex =
               (*_glfw.wl.xkb.keymap_mod_get_index)(_glfw.wl.xkb.keymap,"Shift");
          _glfw.wl.xkb.superIndex = (*_glfw.wl.xkb.keymap_mod_get_index)(_glfw.wl.xkb.keymap,"Mod4")
          ;
          _glfw.wl.xkb.capsLockIndex =
               (*_glfw.wl.xkb.keymap_mod_get_index)(_glfw.wl.xkb.keymap,"Lock");
          _glfw.wl.xkb.numLockIndex =
               (*_glfw.wl.xkb.keymap_mod_get_index)(_glfw.wl.xkb.keymap,"Mod2");
        }
      }
    }
  }
  else {
    close(in_ECX);
  }
  return;
}

Assistant:

static void keyboardHandleKeymap(void* userData,
                                 struct wl_keyboard* keyboard,
                                 uint32_t format,
                                 int fd,
                                 uint32_t size)
{
    struct xkb_keymap* keymap;
    struct xkb_state* state;
    struct xkb_compose_table* composeTable;
    struct xkb_compose_state* composeState;

    char* mapStr;
    const char* locale;

    if (format != WL_KEYBOARD_KEYMAP_FORMAT_XKB_V1)
    {
        close(fd);
        return;
    }

    mapStr = mmap(NULL, size, PROT_READ, MAP_SHARED, fd, 0);
    if (mapStr == MAP_FAILED) {
        close(fd);
        return;
    }

    keymap = xkb_keymap_new_from_string(_glfw.wl.xkb.context,
                                        mapStr,
                                        XKB_KEYMAP_FORMAT_TEXT_V1,
                                        0);
    munmap(mapStr, size);
    close(fd);

    if (!keymap)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to compile keymap");
        return;
    }

    state = xkb_state_new(keymap);
    if (!state)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to create XKB state");
        xkb_keymap_unref(keymap);
        return;
    }

    // Look up the preferred locale, falling back to "C" as default.
    locale = getenv("LC_ALL");
    if (!locale)
        locale = getenv("LC_CTYPE");
    if (!locale)
        locale = getenv("LANG");
    if (!locale)
        locale = "C";

    composeTable =
        xkb_compose_table_new_from_locale(_glfw.wl.xkb.context, locale,
                                          XKB_COMPOSE_COMPILE_NO_FLAGS);
    if (composeTable)
    {
        composeState =
            xkb_compose_state_new(composeTable, XKB_COMPOSE_STATE_NO_FLAGS);
        xkb_compose_table_unref(composeTable);
        if (composeState)
            _glfw.wl.xkb.composeState = composeState;
        else
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Wayland: Failed to create XKB compose state");
    }
    else
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to create XKB compose table");
    }

    xkb_keymap_unref(_glfw.wl.xkb.keymap);
    xkb_state_unref(_glfw.wl.xkb.state);
    _glfw.wl.xkb.keymap = keymap;
    _glfw.wl.xkb.state = state;

    _glfw.wl.xkb.controlIndex  = xkb_keymap_mod_get_index(_glfw.wl.xkb.keymap, "Control");
    _glfw.wl.xkb.altIndex      = xkb_keymap_mod_get_index(_glfw.wl.xkb.keymap, "Mod1");
    _glfw.wl.xkb.shiftIndex    = xkb_keymap_mod_get_index(_glfw.wl.xkb.keymap, "Shift");
    _glfw.wl.xkb.superIndex    = xkb_keymap_mod_get_index(_glfw.wl.xkb.keymap, "Mod4");
    _glfw.wl.xkb.capsLockIndex = xkb_keymap_mod_get_index(_glfw.wl.xkb.keymap, "Lock");
    _glfw.wl.xkb.numLockIndex  = xkb_keymap_mod_get_index(_glfw.wl.xkb.keymap, "Mod2");
}